

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FICDATADecoder::decode(FICDATADecoder *this,uint8_t *data,size_t len)

{
  FICDATADecoder FVar1;
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<const_Assimp::FIValue> sVar3;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,len,in_RCX + len);
  FVar1 = (FICDATADecoder)operator_new(0x38);
  *(undefined8 *)((long)FVar1 + 8) = 0x100000001;
  *(undefined ***)FVar1 = &PTR___Sp_counted_ptr_inplace_009a7ec0;
  *(undefined8 **)((long)FVar1 + 0x18) = (undefined8 *)((long)FVar1 + 0x28);
  *(undefined8 *)((long)FVar1 + 0x20) = 0;
  *(undefined1 *)((long)FVar1 + 0x28) = 0;
  *(undefined ***)((long)FVar1 + 0x10) = &PTR_toString_abi_cxx11__009a7f10;
  std::__cxx11::string::operator=((string *)((long)FVar1 + 0x18),(string *)local_48);
  *this = (FICDATADecoder)((long)FVar1 + 0x10);
  this[1] = FVar1;
  _Var2._M_pi = extraout_RDX;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar3.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FICDATAValue::create(parseUTF8String(data, len));
    }